

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<std::__cxx11::string>
          (ObjectPool<spirv_cross::SPIRString> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_type sVar3;
  _Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
  _Var4;
  ulong uVar5;
  uint uVar6;
  _Head_base<0UL,_spirv_cross::SPIRString_*,_false> _Var7;
  SPIRString *pSVar8;
  size_type *local_58;
  size_type local_48;
  undefined8 uStack_40;
  SmallVector<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,_8UL>
  *local_38;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size == 0) {
    uVar6 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar5 = (ulong)uVar6;
    _Var4.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRString_*,_false>)malloc(uVar5 * 0x30);
    if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl !=
        (SPIRString *)0x0) {
      local_38 = &this->memory;
      _Var7._M_head_impl =
           (SPIRString *)_Var4.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      if (uVar6 != 0) {
        do {
          SmallVector<spirv_cross::SPIRString_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size + 1);
          sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar2] =
               _Var7._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size = sVar2 + 1;
          uVar5 = uVar5 - 1;
          _Var7._M_head_impl = _Var7._M_head_impl + 1;
        } while (uVar5 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,_8UL>
      ::reserve(local_38,(this->memory).
                         super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                         .buffer_size + 1);
      sVar2 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRString_*,_false> =
           _Var4.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
      .buffer_size = sVar2 + 1;
      if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl !=
          (SPIRString *)0x0) goto LAB_00348e4f;
    }
    pSVar8 = (SPIRString *)0x0;
  }
  else {
LAB_00348e4f:
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
    pSVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar2 - 1];
    if (sVar2 != 0) {
      SmallVector<spirv_cross::SPIRString_*,_0UL>::resize(&this->vacants,sVar2 - 1);
    }
    local_58 = (size_type *)(p->_M_dataplus)._M_p;
    paVar1 = &p->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58 == paVar1) {
      local_48 = paVar1->_M_allocated_capacity;
      uStack_40 = *(undefined8 *)((long)&p->field_2 + 8);
      local_58 = &local_48;
    }
    else {
      local_48 = paVar1->_M_allocated_capacity;
    }
    sVar3 = p->_M_string_length;
    (p->_M_dataplus)._M_p = (pointer)paVar1;
    p->_M_string_length = 0;
    (p->field_2)._M_local_buf[0] = '\0';
    (pSVar8->super_IVariant).self.id = 0;
    (pSVar8->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_003fe888;
    paVar1 = &(pSVar8->str).field_2;
    (pSVar8->str)._M_dataplus._M_p = (pointer)paVar1;
    if (local_58 == &local_48) {
      paVar1->_M_allocated_capacity = local_48;
      *(undefined8 *)((long)&(pSVar8->str).field_2 + 8) = uStack_40;
    }
    else {
      (pSVar8->str)._M_dataplus._M_p = (pointer)local_58;
      (pSVar8->str).field_2._M_allocated_capacity = local_48;
    }
    (pSVar8->str)._M_string_length = sVar3;
  }
  return pSVar8;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}